

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O2

void __thiscall
geometrycentral::
DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Edge,_double>_>::
DependentQuantityD(DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Edge,_double>_>
                   *this,MeshData<geometrycentral::surface::Edge,_double> *dataBuffer_,
                  function<void_()> *evaluateFunc_,
                  vector<geometrycentral::DependentQuantity_*,_std::allocator<geometrycentral::DependentQuantity_*>_>
                  *listToJoin)

{
  function<void_()> local_40;
  
  std::function<void_()>::function(&local_40,evaluateFunc_);
  DependentQuantity::DependentQuantity(&this->super_DependentQuantity,&local_40,listToJoin);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  (this->super_DependentQuantity)._vptr_DependentQuantity =
       (_func_int **)&PTR__DependentQuantity_0047b840;
  this->dataBuffer = dataBuffer_;
  return;
}

Assistant:

DependentQuantityD(D* dataBuffer_, std::function<void()> evaluateFunc_, std::vector<DependentQuantity*>& listToJoin)
      : DependentQuantity(evaluateFunc_, listToJoin), dataBuffer(dataBuffer_) {}